

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketInitiator.cpp
# Opt level: O3

void __thiscall FIX::SocketInitiator::onTimeout(SocketInitiator *this,SocketConnector *param_1)

{
  long in_RAX;
  _Rb_tree_node_base *p_Var1;
  sockaddr *__addr;
  int __fd;
  time_t now;
  long local_18;
  
  __fd = (int)param_1;
  local_18 = in_RAX;
  time(&local_18);
  if ((long)this->m_reconnectInterval <= local_18 - this->m_lastConnect) {
    Initiator::connect(&this->super_Initiator,__fd,__addr,this->m_reconnectInterval);
    this->m_lastConnect = local_18;
  }
  for (p_Var1 = (this->m_connections)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->m_connections)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    SocketConnection::onTimeout((SocketConnection *)p_Var1[1]._M_parent);
  }
  return;
}

Assistant:

void SocketInitiator::onTimeout(SocketConnector &) {
  time_t now;
  ::time(&now);

  if ((now - m_lastConnect) >= m_reconnectInterval) {
    connect();
    m_lastConnect = now;
  }

  SocketConnections::iterator i;
  for (i = m_connections.begin(); i != m_connections.end(); ++i) {
    i->second->onTimeout();
  }
}